

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void fdct4x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 uVar41;
  undefined8 uVar42;
  int iVar43;
  int iVar44;
  int32_t *piVar45;
  int *piVar46;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int iVar47;
  int iVar48;
  int iVar54;
  int iVar55;
  int iVar58;
  int iVar59;
  int iVar62;
  int iVar63;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar49;
  int iVar50;
  int iVar56;
  int iVar57;
  int iVar60;
  int iVar61;
  int iVar64;
  int iVar65;
  undefined1 auVar53 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int endidx;
  int startidx;
  __m128i v [8];
  __m128i u [8];
  __m128i rnding;
  __m128i cospi40;
  __m128i cospi24;
  __m128i cospi8;
  __m128i cospi56;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospim32;
  __m128i cospi32;
  int32_t *cospi;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_a88;
  undefined8 uStack_a80;
  char local_96c;
  int local_918;
  int iStack_914;
  int iStack_910;
  int iStack_90c;
  int local_908;
  int iStack_904;
  int iStack_900;
  int iStack_8fc;
  int local_8b8;
  int iStack_8b4;
  int iStack_8b0;
  int iStack_8ac;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  int local_818;
  int iStack_814;
  int iStack_810;
  int iStack_80c;
  int local_808;
  int iStack_804;
  int iStack_800;
  int iStack_7fc;
  int local_7b8;
  int iStack_7b4;
  int iStack_7b0;
  int iStack_7ac;
  int local_7a8;
  int iStack_7a4;
  int iStack_7a0;
  int iStack_79c;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int local_748;
  int iStack_744;
  int iStack_740;
  int iStack_73c;
  int local_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  int local_6e8;
  int iStack_6e4;
  int iStack_6e0;
  int iStack_6dc;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int local_6c8;
  int iStack_6c4;
  int iStack_6c0;
  int iStack_6bc;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  int local_6a8;
  int iStack_6a4;
  int iStack_6a0;
  int iStack_69c;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  int local_688;
  int iStack_684;
  int iStack_680;
  int iStack_67c;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int local_668;
  int iStack_664;
  int iStack_660;
  int iStack_65c;
  int local_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int local_648;
  int iStack_644;
  int iStack_640;
  int iStack_63c;
  int local_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  int local_5e8;
  int iStack_5e4;
  int iStack_5e0;
  int iStack_5dc;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  int local_5a8;
  int iStack_5a4;
  int iStack_5a0;
  int iStack_59c;
  int local_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  int local_548;
  int iStack_544;
  int iStack_540;
  int iStack_53c;
  int local_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  int local_528;
  int iStack_524;
  int iStack_520;
  int iStack_51c;
  int local_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  int local_508;
  int iStack_504;
  int iStack_500;
  int iStack_4fc;
  int local_4f8;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  int local_4e8;
  int iStack_4e4;
  int iStack_4e0;
  int iStack_4dc;
  
  piVar45 = cospi_arr(in_EDX);
  iVar1 = piVar45[0x20];
  uVar41 = CONCAT44(iVar1,iVar1);
  uVar42 = CONCAT44(iVar1,iVar1);
  iVar43 = -piVar45[0x20];
  iVar1 = piVar45[0x30];
  iVar2 = piVar45[0x10];
  iVar3 = piVar45[0x38];
  iVar4 = piVar45[8];
  iVar5 = piVar45[0x18];
  iVar6 = piVar45[0x28];
  local_96c = (char)in_EDX;
  iVar44 = 1 << (local_96c - 1U & 0x1f);
  uVar7 = in_RDI[(long)(in_ECX * 7) * 2];
  uVar8 = (in_RDI + (long)(in_ECX * 7) * 2)[1];
  local_688 = (int)*in_RDI;
  iStack_684 = (int)((ulong)*in_RDI >> 0x20);
  iStack_680 = (int)in_RDI[1];
  iStack_67c = (int)((ulong)in_RDI[1] >> 0x20);
  local_698 = (int)uVar7;
  iStack_694 = (int)((ulong)uVar7 >> 0x20);
  iStack_690 = (int)uVar8;
  iStack_68c = (int)((ulong)uVar8 >> 0x20);
  uVar7 = in_RDI[(long)(in_ECX * 7) * 2];
  uVar8 = (in_RDI + (long)(in_ECX * 7) * 2)[1];
  local_4e8 = (int)*in_RDI;
  iStack_4e4 = (int)((ulong)*in_RDI >> 0x20);
  iStack_4e0 = (int)in_RDI[1];
  iStack_4dc = (int)((ulong)in_RDI[1] >> 0x20);
  local_4f8 = (int)uVar7;
  iStack_4f4 = (int)((ulong)uVar7 >> 0x20);
  iStack_4f0 = (int)uVar8;
  iStack_4ec = (int)((ulong)uVar8 >> 0x20);
  uVar7 = in_RDI[(long)in_ECX * 2];
  uVar8 = (in_RDI + (long)in_ECX * 2)[1];
  uVar9 = in_RDI[(long)(in_ECX * 6) * 2];
  uVar10 = (in_RDI + (long)(in_ECX * 6) * 2)[1];
  local_6a8 = (int)uVar7;
  iStack_6a4 = (int)((ulong)uVar7 >> 0x20);
  iStack_6a0 = (int)uVar8;
  iStack_69c = (int)((ulong)uVar8 >> 0x20);
  local_6b8 = (int)uVar9;
  iStack_6b4 = (int)((ulong)uVar9 >> 0x20);
  iStack_6b0 = (int)uVar10;
  iStack_6ac = (int)((ulong)uVar10 >> 0x20);
  uVar7 = in_RDI[(long)in_ECX * 2];
  uVar8 = (in_RDI + (long)in_ECX * 2)[1];
  uVar9 = in_RDI[(long)(in_ECX * 6) * 2];
  uVar10 = (in_RDI + (long)(in_ECX * 6) * 2)[1];
  local_508 = (int)uVar7;
  iStack_504 = (int)((ulong)uVar7 >> 0x20);
  iStack_500 = (int)uVar8;
  iStack_4fc = (int)((ulong)uVar8 >> 0x20);
  local_518 = (int)uVar9;
  iStack_514 = (int)((ulong)uVar9 >> 0x20);
  iStack_510 = (int)uVar10;
  iStack_50c = (int)((ulong)uVar10 >> 0x20);
  uVar7 = in_RDI[(long)(in_ECX * 2) * 2];
  uVar8 = (in_RDI + (long)(in_ECX * 2) * 2)[1];
  uVar9 = in_RDI[(long)(in_ECX * 5) * 2];
  uVar10 = (in_RDI + (long)(in_ECX * 5) * 2)[1];
  local_6c8 = (int)uVar7;
  iStack_6c4 = (int)((ulong)uVar7 >> 0x20);
  iStack_6c0 = (int)uVar8;
  iStack_6bc = (int)((ulong)uVar8 >> 0x20);
  local_6d8 = (int)uVar9;
  iStack_6d4 = (int)((ulong)uVar9 >> 0x20);
  iStack_6d0 = (int)uVar10;
  iStack_6cc = (int)((ulong)uVar10 >> 0x20);
  uVar7 = in_RDI[(long)(in_ECX * 2) * 2];
  uVar8 = (in_RDI + (long)(in_ECX * 2) * 2)[1];
  uVar9 = in_RDI[(long)(in_ECX * 5) * 2];
  uVar10 = (in_RDI + (long)(in_ECX * 5) * 2)[1];
  local_528 = (int)uVar7;
  iStack_524 = (int)((ulong)uVar7 >> 0x20);
  iStack_520 = (int)uVar8;
  iStack_51c = (int)((ulong)uVar8 >> 0x20);
  local_538 = (int)uVar9;
  iStack_534 = (int)((ulong)uVar9 >> 0x20);
  iStack_530 = (int)uVar10;
  iStack_52c = (int)((ulong)uVar10 >> 0x20);
  uVar7 = in_RDI[(long)(in_ECX * 3) * 2];
  uVar8 = (in_RDI + (long)(in_ECX * 3) * 2)[1];
  uVar9 = in_RDI[(long)(in_ECX * 4) * 2];
  uVar10 = (in_RDI + (long)(in_ECX * 4) * 2)[1];
  local_6e8 = (int)uVar7;
  iStack_6e4 = (int)((ulong)uVar7 >> 0x20);
  iStack_6e0 = (int)uVar8;
  iStack_6dc = (int)((ulong)uVar8 >> 0x20);
  local_6f8 = (int)uVar9;
  iStack_6f4 = (int)((ulong)uVar9 >> 0x20);
  iStack_6f0 = (int)uVar10;
  iStack_6ec = (int)((ulong)uVar10 >> 0x20);
  uVar7 = in_RDI[(long)(in_ECX * 3) * 2];
  uVar8 = (in_RDI + (long)(in_ECX * 3) * 2)[1];
  uVar9 = in_RDI[(long)(in_ECX * 4) * 2];
  uVar10 = (in_RDI + (long)(in_ECX * 4) * 2)[1];
  local_548 = (int)uVar7;
  iStack_544 = (int)((ulong)uVar7 >> 0x20);
  iStack_540 = (int)uVar8;
  iStack_53c = (int)((ulong)uVar8 >> 0x20);
  local_558 = (int)uVar9;
  iStack_554 = (int)((ulong)uVar9 >> 0x20);
  iStack_550 = (int)uVar10;
  iStack_54c = (int)((ulong)uVar10 >> 0x20);
  local_b08 = CONCAT44(iStack_684 + iStack_694 + iStack_6e4 + iStack_6f4,
                       local_688 + local_698 + local_6e8 + local_6f8);
  uStack_b00._0_4_ = iStack_680 + iStack_690 + iStack_6e0 + iStack_6f0;
  uStack_b00._4_4_ = iStack_67c + iStack_68c + iStack_6dc + iStack_6ec;
  iVar47 = (local_688 + local_698) - (local_6e8 + local_6f8);
  iVar54 = (iStack_684 + iStack_694) - (iStack_6e4 + iStack_6f4);
  iVar58 = (iStack_680 + iStack_690) - (iStack_6e0 + iStack_6f0);
  iVar62 = (iStack_67c + iStack_68c) - (iStack_6dc + iStack_6ec);
  local_af8 = CONCAT44(iStack_6a4 + iStack_6b4 + iStack_6c4 + iStack_6d4,
                       local_6a8 + local_6b8 + local_6c8 + local_6d8);
  uStack_af0._0_4_ = iStack_6a0 + iStack_6b0 + iStack_6c0 + iStack_6d0;
  uStack_af0._4_4_ = iStack_69c + iStack_6ac + iStack_6bc + iStack_6cc;
  iVar48 = (local_6a8 + local_6b8) - (local_6c8 + local_6d8);
  iVar55 = (iStack_6a4 + iStack_6b4) - (iStack_6c4 + iStack_6d4);
  iVar59 = (iStack_6a0 + iStack_6b0) - (iStack_6c0 + iStack_6d0);
  iVar63 = (iStack_69c + iStack_6ac) - (iStack_6bc + iStack_6cc);
  auVar40._4_4_ = iStack_524 - iStack_534;
  auVar40._0_4_ = local_528 - local_538;
  auVar40._12_4_ = iStack_51c - iStack_52c;
  auVar40._8_4_ = iStack_520 - iStack_530;
  auVar39._8_8_ = CONCAT44(iVar43,iVar43);
  auVar39._0_8_ = CONCAT44(iVar43,iVar43);
  auVar51 = pmulld(auVar40,auVar39);
  auVar38._4_4_ = iStack_504 - iStack_514;
  auVar38._0_4_ = local_508 - local_518;
  auVar38._12_4_ = iStack_4fc - iStack_50c;
  auVar38._8_4_ = iStack_500 - iStack_510;
  auVar37._8_8_ = uVar42;
  auVar37._0_8_ = uVar41;
  auVar52 = pmulld(auVar38,auVar37);
  local_748 = auVar51._0_4_;
  iStack_744 = auVar51._4_4_;
  iStack_740 = auVar51._8_4_;
  iStack_73c = auVar51._12_4_;
  local_758 = auVar52._0_4_;
  iStack_754 = auVar52._4_4_;
  iStack_750 = auVar52._8_4_;
  iStack_74c = auVar52._12_4_;
  auVar51 = ZEXT416(in_EDX);
  iVar49 = local_748 + local_758 + iVar44 >> auVar51;
  iVar56 = iStack_744 + iStack_754 + iVar44 >> auVar51;
  iVar60 = iStack_740 + iStack_750 + iVar44 >> auVar51;
  iVar64 = iStack_73c + iStack_74c + iVar44 >> auVar51;
  auVar36._4_4_ = iStack_524 - iStack_534;
  auVar36._0_4_ = local_528 - local_538;
  auVar36._12_4_ = iStack_51c - iStack_52c;
  auVar36._8_4_ = iStack_520 - iStack_530;
  auVar35._8_8_ = uVar42;
  auVar35._0_8_ = uVar41;
  auVar51 = pmulld(auVar36,auVar35);
  auVar34._4_4_ = iStack_504 - iStack_514;
  auVar34._0_4_ = local_508 - local_518;
  auVar34._12_4_ = iStack_4fc - iStack_50c;
  auVar34._8_4_ = iStack_500 - iStack_510;
  auVar33._8_8_ = CONCAT44(iVar43,iVar43);
  auVar33._0_8_ = CONCAT44(iVar43,iVar43);
  auVar52 = pmulld(auVar34,auVar33);
  local_5a8 = auVar51._0_4_;
  iStack_5a4 = auVar51._4_4_;
  iStack_5a0 = auVar51._8_4_;
  iStack_59c = auVar51._12_4_;
  local_5b8 = auVar52._0_4_;
  iStack_5b4 = auVar52._4_4_;
  iStack_5b0 = auVar52._8_4_;
  iStack_5ac = auVar52._12_4_;
  auVar51 = ZEXT416(in_EDX);
  iVar50 = (local_5a8 - local_5b8) + iVar44 >> auVar51;
  iVar57 = (iStack_5a4 - iStack_5b4) + iVar44 >> auVar51;
  iVar61 = (iStack_5a0 - iStack_5b0) + iVar44 >> auVar51;
  iVar65 = (iStack_59c - iStack_5ac) + iVar44 >> auVar51;
  auVar32._8_8_ = uStack_b00;
  auVar32._0_8_ = local_b08;
  auVar31._8_8_ = uVar42;
  auVar31._0_8_ = uVar41;
  auVar51 = pmulld(auVar32,auVar31);
  auVar30._8_8_ = uStack_af0;
  auVar30._0_8_ = local_af8;
  auVar66._8_8_ = uVar42;
  auVar66._0_8_ = uVar41;
  auVar52 = pmulld(auVar30,auVar66);
  local_7a8 = auVar51._0_4_;
  iStack_7a4 = auVar51._4_4_;
  iStack_7a0 = auVar51._8_4_;
  iStack_79c = auVar51._12_4_;
  local_7b8 = auVar52._0_4_;
  iStack_7b4 = auVar52._4_4_;
  iStack_7b0 = auVar52._8_4_;
  iStack_7ac = auVar52._12_4_;
  auVar51 = ZEXT416(in_EDX);
  local_a88 = CONCAT44(iStack_7a4 + iStack_7b4 + iVar44 >> auVar51,
                       local_7a8 + local_7b8 + iVar44 >> auVar51);
  uStack_a80._0_4_ = iStack_7a0 + iStack_7b0 + iVar44 >> auVar51;
  uStack_a80._4_4_ = iStack_79c + iStack_7ac + iVar44 >> auVar51;
  auVar66 = ZEXT416(in_EDX);
  auVar29._4_4_ = iVar55;
  auVar29._0_4_ = iVar48;
  auVar29._12_4_ = iVar63;
  auVar29._8_4_ = iVar59;
  auVar28._8_8_ = CONCAT44(iVar1,iVar1);
  auVar28._0_8_ = CONCAT44(iVar1,iVar1);
  auVar51 = pmulld(auVar29,auVar28);
  auVar27._4_4_ = iVar54;
  auVar27._0_4_ = iVar47;
  auVar27._12_4_ = iVar62;
  auVar27._8_4_ = iVar58;
  auVar67._8_8_ = CONCAT44(iVar2,iVar2);
  auVar67._0_8_ = CONCAT44(iVar2,iVar2);
  auVar52 = pmulld(auVar27,auVar67);
  local_808 = auVar51._0_4_;
  iStack_804 = auVar51._4_4_;
  iStack_800 = auVar51._8_4_;
  iStack_7fc = auVar51._12_4_;
  local_818 = auVar52._0_4_;
  iStack_814 = auVar52._4_4_;
  iStack_810 = auVar52._8_4_;
  iStack_80c = auVar52._12_4_;
  auVar67 = ZEXT416(in_EDX);
  auVar26._4_4_ = iVar55;
  auVar26._0_4_ = iVar48;
  auVar26._12_4_ = iVar63;
  auVar26._8_4_ = iVar59;
  auVar25._8_8_ = CONCAT44(iVar2,iVar2);
  auVar25._0_8_ = CONCAT44(iVar2,iVar2);
  auVar51 = pmulld(auVar26,auVar25);
  auVar24._4_4_ = iVar54;
  auVar24._0_4_ = iVar47;
  auVar24._12_4_ = iVar62;
  auVar24._8_4_ = iVar58;
  auVar68._8_8_ = CONCAT44(iVar1,iVar1);
  auVar68._0_8_ = CONCAT44(iVar1,iVar1);
  auVar52 = pmulld(auVar24,auVar68);
  local_5e8 = auVar52._0_4_;
  iStack_5e4 = auVar52._4_4_;
  iStack_5e0 = auVar52._8_4_;
  iStack_5dc = auVar52._12_4_;
  local_5f8 = auVar51._0_4_;
  iStack_5f4 = auVar51._4_4_;
  iStack_5f0 = auVar51._8_4_;
  iStack_5ec = auVar51._12_4_;
  auVar68 = ZEXT416(in_EDX);
  iVar43 = (local_548 - local_558) + iVar49;
  iVar48 = (iStack_544 - iStack_554) + iVar56;
  iVar55 = (iStack_540 - iStack_550) + iVar60;
  iVar59 = (iStack_53c - iStack_54c) + iVar64;
  iVar49 = (local_548 - local_558) - iVar49;
  iVar56 = (iStack_544 - iStack_554) - iVar56;
  iVar60 = (iStack_540 - iStack_550) - iVar60;
  iVar64 = (iStack_53c - iStack_54c) - iVar64;
  iVar47 = (local_4e8 - local_4f8) - iVar50;
  iVar54 = (iStack_4e4 - iStack_4f4) - iVar57;
  iVar58 = (iStack_4e0 - iStack_4f0) - iVar61;
  iVar62 = (iStack_4dc - iStack_4ec) - iVar65;
  iVar50 = (local_4e8 - local_4f8) + iVar50;
  iVar57 = (iStack_4e4 - iStack_4f4) + iVar57;
  iVar61 = (iStack_4e0 - iStack_4f0) + iVar61;
  iVar65 = (iStack_4dc - iStack_4ec) + iVar65;
  auVar23._4_4_ = iVar48;
  auVar23._0_4_ = iVar43;
  auVar23._12_4_ = iVar59;
  auVar23._8_4_ = iVar55;
  auVar22._8_8_ = CONCAT44(iVar3,iVar3);
  auVar22._0_8_ = CONCAT44(iVar3,iVar3);
  auVar51 = pmulld(auVar23,auVar22);
  auVar21._4_4_ = iVar57;
  auVar21._0_4_ = iVar50;
  auVar21._12_4_ = iVar65;
  auVar21._8_4_ = iVar61;
  auVar20._8_8_ = CONCAT44(iVar4,iVar4);
  auVar20._0_8_ = CONCAT44(iVar4,iVar4);
  auVar52 = pmulld(auVar21,auVar20);
  local_8a8 = auVar51._0_4_;
  iStack_8a4 = auVar51._4_4_;
  iStack_8a0 = auVar51._8_4_;
  iStack_89c = auVar51._12_4_;
  local_8b8 = auVar52._0_4_;
  iStack_8b4 = auVar52._4_4_;
  iStack_8b0 = auVar52._8_4_;
  iStack_8ac = auVar52._12_4_;
  auVar51 = ZEXT416(in_EDX);
  piVar46 = (int *)(in_RSI + (long)in_ECX * 2);
  *piVar46 = local_8a8 + local_8b8 + iVar44 >> auVar51;
  piVar46[1] = iStack_8a4 + iStack_8b4 + iVar44 >> auVar51;
  piVar46[2] = iStack_8a0 + iStack_8b0 + iVar44 >> auVar51;
  piVar46[3] = iStack_89c + iStack_8ac + iVar44 >> auVar51;
  auVar19._4_4_ = iVar48;
  auVar19._0_4_ = iVar43;
  auVar19._12_4_ = iVar59;
  auVar19._8_4_ = iVar55;
  auVar18._8_8_ = CONCAT44(iVar4,iVar4);
  auVar18._0_8_ = CONCAT44(iVar4,iVar4);
  auVar51 = pmulld(auVar19,auVar18);
  auVar17._4_4_ = iVar57;
  auVar17._0_4_ = iVar50;
  auVar17._12_4_ = iVar65;
  auVar17._8_4_ = iVar61;
  auVar16._8_8_ = CONCAT44(iVar3,iVar3);
  auVar16._0_8_ = CONCAT44(iVar3,iVar3);
  auVar52 = pmulld(auVar17,auVar16);
  local_648 = auVar52._0_4_;
  iStack_644 = auVar52._4_4_;
  iStack_640 = auVar52._8_4_;
  iStack_63c = auVar52._12_4_;
  local_658 = auVar51._0_4_;
  iStack_654 = auVar51._4_4_;
  iStack_650 = auVar51._8_4_;
  iStack_64c = auVar51._12_4_;
  auVar51 = ZEXT416(in_EDX);
  piVar46 = (int *)(in_RSI + (long)(in_ECX * 7) * 2);
  *piVar46 = (local_648 - local_658) + iVar44 >> auVar51;
  piVar46[1] = (iStack_644 - iStack_654) + iVar44 >> auVar51;
  piVar46[2] = (iStack_640 - iStack_650) + iVar44 >> auVar51;
  piVar46[3] = (iStack_63c - iStack_64c) + iVar44 >> auVar51;
  auVar15._4_4_ = iVar56;
  auVar15._0_4_ = iVar49;
  auVar15._12_4_ = iVar64;
  auVar15._8_4_ = iVar60;
  auVar14._8_8_ = CONCAT44(iVar5,iVar5);
  auVar14._0_8_ = CONCAT44(iVar5,iVar5);
  auVar51 = pmulld(auVar15,auVar14);
  auVar13._4_4_ = iVar54;
  auVar13._0_4_ = iVar47;
  auVar13._12_4_ = iVar62;
  auVar13._8_4_ = iVar58;
  auVar12._8_8_ = CONCAT44(iVar6,iVar6);
  auVar12._0_8_ = CONCAT44(iVar6,iVar6);
  auVar52 = pmulld(auVar13,auVar12);
  local_908 = auVar51._0_4_;
  iStack_904 = auVar51._4_4_;
  iStack_900 = auVar51._8_4_;
  iStack_8fc = auVar51._12_4_;
  local_918 = auVar52._0_4_;
  iStack_914 = auVar52._4_4_;
  iStack_910 = auVar52._8_4_;
  iStack_90c = auVar52._12_4_;
  auVar51 = ZEXT416(in_EDX);
  piVar46 = (int *)(in_RSI + (long)(in_ECX * 5) * 2);
  *piVar46 = local_908 + local_918 + iVar44 >> auVar51;
  piVar46[1] = iStack_904 + iStack_914 + iVar44 >> auVar51;
  piVar46[2] = iStack_900 + iStack_910 + iVar44 >> auVar51;
  piVar46[3] = iStack_8fc + iStack_90c + iVar44 >> auVar51;
  auVar11._4_4_ = iVar56;
  auVar11._0_4_ = iVar49;
  auVar11._12_4_ = iVar64;
  auVar11._8_4_ = iVar60;
  auVar53._8_8_ = CONCAT44(iVar6,iVar6);
  auVar53._0_8_ = CONCAT44(iVar6,iVar6);
  auVar53 = pmulld(auVar11,auVar53);
  auVar52._4_4_ = iVar54;
  auVar52._0_4_ = iVar47;
  auVar52._12_4_ = iVar62;
  auVar52._8_4_ = iVar58;
  auVar51._8_8_ = CONCAT44(iVar5,iVar5);
  auVar51._0_8_ = CONCAT44(iVar5,iVar5);
  auVar51 = pmulld(auVar52,auVar51);
  local_668 = auVar51._0_4_;
  iStack_664 = auVar51._4_4_;
  iStack_660 = auVar51._8_4_;
  iStack_65c = auVar51._12_4_;
  local_678 = auVar53._0_4_;
  iStack_674 = auVar53._4_4_;
  iStack_670 = auVar53._8_4_;
  iStack_66c = auVar53._12_4_;
  auVar51 = ZEXT416(in_EDX);
  piVar46 = (int *)(in_RSI + (long)(in_ECX * 3) * 2);
  *piVar46 = (local_668 - local_678) + iVar44 >> auVar51;
  piVar46[1] = (iStack_664 - iStack_674) + iVar44 >> auVar51;
  piVar46[2] = (iStack_660 - iStack_670) + iVar44 >> auVar51;
  piVar46[3] = (iStack_65c - iStack_66c) + iVar44 >> auVar51;
  *in_RSI = local_a88;
  in_RSI[1] = uStack_a80;
  in_RSI[(long)(in_ECX << 2) * 2] =
       CONCAT44((iStack_7a4 - iStack_7b4) + iVar44 >> auVar66,
                (local_7a8 - local_7b8) + iVar44 >> auVar66);
  (in_RSI + (long)(in_ECX << 2) * 2)[1] =
       CONCAT44((iStack_79c - iStack_7ac) + iVar44 >> auVar66,
                (iStack_7a0 - iStack_7b0) + iVar44 >> auVar66);
  in_RSI[(long)(in_ECX << 1) * 2] =
       CONCAT44(iStack_804 + iStack_814 + iVar44 >> auVar67,
                local_808 + local_818 + iVar44 >> auVar67);
  (in_RSI + (long)(in_ECX << 1) * 2)[1] =
       CONCAT44(iStack_7fc + iStack_80c + iVar44 >> auVar67,
                iStack_800 + iStack_810 + iVar44 >> auVar67);
  in_RSI[(long)(in_ECX * 6) * 2] =
       CONCAT44((iStack_5e4 - iStack_5f4) + iVar44 >> auVar68,
                (local_5e8 - local_5f8) + iVar44 >> auVar68);
  (in_RSI + (long)(in_ECX * 6) * 2)[1] =
       CONCAT44((iStack_5dc - iStack_5ec) + iVar44 >> auVar68,
                (iStack_5e0 - iStack_5f0) + iVar44 >> auVar68);
  return;
}

Assistant:

static void fdct4x8_sse4_1(__m128i *in, __m128i *out, int bit,
                           const int col_num) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  __m128i u[8], v[8];

  int startidx = 0 * col_num;
  int endidx = 7 * col_num;
  // Even 8 points 0, 2, ..., 14
  // stage 0
  // stage 1
  u[0] = _mm_add_epi32(in[startidx], in[endidx]);
  v[7] = _mm_sub_epi32(in[startidx], in[endidx]);  // v[7]
  startidx += col_num;
  endidx -= col_num;
  u[1] = _mm_add_epi32(in[startidx], in[endidx]);
  u[6] = _mm_sub_epi32(in[startidx], in[endidx]);
  startidx += col_num;
  endidx -= col_num;
  u[2] = _mm_add_epi32(in[startidx], in[endidx]);
  u[5] = _mm_sub_epi32(in[startidx], in[endidx]);
  startidx += col_num;
  endidx -= col_num;
  u[3] = _mm_add_epi32(in[startidx], in[endidx]);
  v[4] = _mm_sub_epi32(in[startidx], in[endidx]);  // v[4]

  // stage 2
  v[0] = _mm_add_epi32(u[0], u[3]);
  v[3] = _mm_sub_epi32(u[0], u[3]);
  v[1] = _mm_add_epi32(u[1], u[2]);
  v[2] = _mm_sub_epi32(u[1], u[2]);

  v[5] = _mm_mullo_epi32(u[5], cospim32);
  v[6] = _mm_mullo_epi32(u[6], cospi32);
  v[5] = _mm_add_epi32(v[5], v[6]);
  v[5] = _mm_add_epi32(v[5], rnding);
  v[5] = _mm_srai_epi32(v[5], bit);

  u[0] = _mm_mullo_epi32(u[5], cospi32);
  v[6] = _mm_mullo_epi32(u[6], cospim32);
  v[6] = _mm_sub_epi32(u[0], v[6]);
  v[6] = _mm_add_epi32(v[6], rnding);
  v[6] = _mm_srai_epi32(v[6], bit);

  // stage 3
  // type 0
  v[0] = _mm_mullo_epi32(v[0], cospi32);
  v[1] = _mm_mullo_epi32(v[1], cospi32);
  u[0] = _mm_add_epi32(v[0], v[1]);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_sub_epi32(v[0], v[1]);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // type 1
  v[0] = _mm_mullo_epi32(v[2], cospi48);
  v[1] = _mm_mullo_epi32(v[3], cospi16);
  u[2] = _mm_add_epi32(v[0], v[1]);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  v[0] = _mm_mullo_epi32(v[2], cospi16);
  v[1] = _mm_mullo_epi32(v[3], cospi48);
  u[3] = _mm_sub_epi32(v[1], v[0]);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  u[4] = _mm_add_epi32(v[4], v[5]);
  u[5] = _mm_sub_epi32(v[4], v[5]);
  u[6] = _mm_sub_epi32(v[7], v[6]);
  u[7] = _mm_add_epi32(v[7], v[6]);

  // stage 4
  // stage 5
  v[0] = _mm_mullo_epi32(u[4], cospi56);
  v[1] = _mm_mullo_epi32(u[7], cospi8);
  v[0] = _mm_add_epi32(v[0], v[1]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[1 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[4]

  v[0] = _mm_mullo_epi32(u[4], cospi8);
  v[1] = _mm_mullo_epi32(u[7], cospi56);
  v[0] = _mm_sub_epi32(v[1], v[0]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[7 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[7]

  v[0] = _mm_mullo_epi32(u[5], cospi24);
  v[1] = _mm_mullo_epi32(u[6], cospi40);
  v[0] = _mm_add_epi32(v[0], v[1]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[5 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[5]

  v[0] = _mm_mullo_epi32(u[5], cospi40);
  v[1] = _mm_mullo_epi32(u[6], cospi24);
  v[0] = _mm_sub_epi32(v[1], v[0]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[3 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[6]

  out[0 * col_num] = u[0];  // buf0[0]
  out[4 * col_num] = u[1];  // buf0[1]
  out[2 * col_num] = u[2];  // buf0[2]
  out[6 * col_num] = u[3];  // buf0[3]
}